

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

void __thiscall
lest::passing::passing(passing *this,location *where_,text *expr_,text *decomposition_,bool zen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  bool bVar2;
  allocator local_17b;
  allocator local_17a;
  allocator local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_138;
  size_type local_130;
  char local_128 [8];
  undefined8 uStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  char local_c8 [8];
  undefined8 uStack_c0;
  text local_b8;
  text local_98;
  text local_78;
  location local_58;
  
  std::__cxx11::string::string((string *)&local_d8,"passed",&local_179);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  if (local_d8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8) {
    local_98.field_2._8_8_ = uStack_c0;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)local_d8;
  }
  local_98._M_string_length = local_d0;
  local_d0 = 0;
  local_c8[0] = '\0';
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_c8;
  location::location(&local_58,where_);
  if (zen) {
    std::__cxx11::string::string((string *)&local_118,"",&local_17a);
    paVar1 = &local_118.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p == paVar1) {
      local_178.field_2._8_8_ = local_118.field_2._8_8_;
      local_118._M_dataplus._M_p = (pointer)&local_178.field_2;
    }
    local_178.field_2._M_allocated_capacity =
         (ulong)(uint7)local_118.field_2._M_allocated_capacity._1_7_ << 8;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    bVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p == &local_178.field_2;
    local_158._M_dataplus._M_p = local_118._M_dataplus._M_p;
    local_118._M_dataplus._M_p = (pointer)paVar1;
    if (bVar2) {
      local_158.field_2._8_8_ = local_178.field_2._8_8_;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
  }
  else {
    std::operator+(&local_178," for ",decomposition_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == &local_178.field_2) {
      local_158.field_2._8_8_ = local_178.field_2._8_8_;
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    }
    else {
      local_158._M_dataplus._M_p = local_178._M_dataplus._M_p;
    }
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_allocated_capacity =
       local_178.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::operator+(&local_f8,expr_,&local_158);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p == &local_f8.field_2) {
    local_b8.field_2._8_8_ = local_f8.field_2._8_8_;
  }
  else {
    local_b8._M_dataplus._M_p = local_f8._M_dataplus._M_p;
  }
  local_b8._M_string_length = local_f8._M_string_length;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_local_buf[0] = '\0';
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::string((string *)&local_138,"",&local_17b);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  if (local_138 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128) {
    local_78.field_2._8_8_ = uStack_120;
  }
  else {
    local_78._M_dataplus._M_p = (pointer)local_138;
  }
  local_78._M_string_length = local_130;
  local_130 = 0;
  local_128[0] = '\0';
  local_138 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128;
  success::success(&this->super_success,&local_98,&local_58,&local_b8,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_158);
  this_00 = &local_178;
  if (zen) {
    std::__cxx11::string::~string((string *)this_00);
    this_00 = &local_118;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_d8);
  *(undefined ***)&(this->super_success).super_message = &PTR__message_0012aca0;
  return;
}

Assistant:

passing( location where_, text expr_, text decomposition_, bool zen )
    : success( "passed", where_, expr_ + (zen ? "":" for " + decomposition_) ) {}